

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dot.hpp
# Opt level: O2

void remora::bindings::
     dot<remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>,remora::vector<double,remora::cpu_tag>,double>
               (undefined8 *v1,long *v2,double *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  double dVar6;
  
  *result = 0.0;
  pdVar4 = (double *)*v1;
  lVar1 = v1[1];
  lVar2 = v1[2];
  lVar3 = *v2;
  dVar6 = 0.0;
  for (lVar5 = 0; lVar1 != lVar5; lVar5 = lVar5 + 1) {
    dVar6 = dVar6 + *pdVar4 * *(double *)(lVar3 + lVar5 * 8);
    *result = dVar6;
    pdVar4 = pdVar4 + lVar2;
  }
  return;
}

Assistant:

void dot(
	vector_expression<E1, cpu_tag> const& v1,
	vector_expression<E2, cpu_tag> const& v2,
	result_type& result,
	dense_tag,
	dense_tag
) {
	result = result_type();
	auto v1_end = v1().end();
	auto v2_pos = v2().begin();
	for(auto v1_pos = v1().begin(); v1_pos != v1_end; ++v1_pos, ++v2_pos){
		result += (*v1_pos) * (*v2_pos);
	}
}